

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O2

int KINBBDPrecSetup(N_Vector uu,N_Vector uscale,N_Vector fval,N_Vector fscale,void *bbd_data)

{
  KINMem kin_mem;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  sunrealtype *psVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long j;
  long lVar19;
  char *msgfmt;
  long lVar20;
  double dVar21;
  double dVar22;
  long local_90;
  
  kin_mem = *(KINMem *)((long)bbd_data + 0x90);
  iVar7 = SUNMatZero(*(undefined8 *)((long)bbd_data + 0x40));
  if (iVar7 == 0) {
    uVar1 = *(undefined8 *)((long)bbd_data + 0x60);
    uVar2 = *(undefined8 *)((long)bbd_data + 0x68);
    uVar3 = *(undefined8 *)((long)bbd_data + 0x70);
    lVar4 = *(long *)((long)bbd_data + 0x90);
    N_VScale(0x3ff0000000000000,uu,uVar3);
    lVar8 = N_VGetArrayPointer(uu);
    lVar9 = N_VGetArrayPointer(uscale);
    lVar10 = N_VGetArrayPointer(uVar1);
    lVar11 = N_VGetArrayPointer(uVar2);
    lVar12 = N_VGetArrayPointer(uVar3);
    if ((*(code **)((long)bbd_data + 0x30) == (code *)0x0) ||
       (iVar7 = (**(code **)((long)bbd_data + 0x30))
                          (*(undefined8 *)((long)bbd_data + 0x38),uu,*(undefined8 *)(lVar4 + 0x18)),
       iVar7 == 0)) {
      iVar7 = (**(code **)((long)bbd_data + 0x28))
                        (*(undefined8 *)((long)bbd_data + 0x38),uu,uVar1,
                         *(undefined8 *)(lVar4 + 0x18));
      *(long *)((long)bbd_data + 0x88) = *(long *)((long)bbd_data + 0x88) + 1;
      if (iVar7 == 0) {
        lVar5 = *bbd_data;
        lVar6 = *(long *)((long)bbd_data + 8);
        lVar20 = lVar6 + lVar5 + 1;
        lVar19 = *(long *)((long)bbd_data + 0x38);
        lVar17 = lVar19;
        if (lVar20 < lVar19) {
          lVar17 = lVar20;
        }
        if (lVar17 < 1) {
          lVar17 = 0;
        }
        lVar15 = 1;
        local_90 = 0;
        while( true ) {
          if (lVar15 == lVar17 + 1) {
            iVar7 = SUNLinSolSetup_Band(*(SUNLinearSolver *)((long)bbd_data + 0x48),
                                        *(SUNMatrix *)((long)bbd_data + 0x40));
            return iVar7;
          }
          j = lVar15 + -1;
          for (lVar13 = j; lVar13 < lVar19; lVar13 = lVar13 + lVar20) {
            dVar22 = 1.0 / *(double *)(lVar9 + lVar13 * 8);
            dVar21 = ABS(*(double *)(lVar8 + lVar13 * 8));
            if (dVar21 <= dVar22) {
              dVar21 = dVar22;
            }
            *(double *)(lVar12 + lVar13 * 8) =
                 dVar21 * *(double *)((long)bbd_data + 0x20) + *(double *)(lVar12 + lVar13 * 8);
          }
          iVar7 = (**(code **)((long)bbd_data + 0x28))
                            (lVar19,uVar3,uVar2,*(undefined8 *)(lVar4 + 0x18));
          *(long *)((long)bbd_data + 0x88) = *(long *)((long)bbd_data + 0x88) + 1;
          if (iVar7 != 0) break;
          lVar19 = *(long *)((long)bbd_data + 0x38);
          lVar13 = local_90;
          for (; j < lVar19; j = j + lVar20) {
            *(undefined8 *)(lVar12 + j * 8) = *(undefined8 *)(lVar8 + j * 8);
            psVar14 = SUNBandMatrix_Column(*(SUNMatrix *)((long)bbd_data + 0x40),j);
            dVar22 = 1.0 / *(double *)(lVar9 + j * 8);
            dVar21 = ABS(*(double *)(lVar8 + j * 8));
            if (dVar21 <= dVar22) {
              dVar21 = dVar22;
            }
            dVar22 = *(double *)((long)bbd_data + 0x20);
            lVar16 = j - *(long *)((long)bbd_data + 0x10);
            if (lVar16 < 1) {
              lVar16 = 0;
            }
            lVar18 = *(long *)((long)bbd_data + 0x18) + j;
            lVar19 = *(long *)((long)bbd_data + 0x38);
            if (lVar19 + -1 <= lVar18) {
              lVar18 = lVar19 + -1;
            }
            for (; lVar16 <= lVar18; lVar16 = lVar16 + 1) {
              *(double *)((long)psVar14 + lVar16 * 8 + lVar13) =
                   (*(double *)(lVar11 + lVar16 * 8) - *(double *)(lVar10 + lVar16 * 8)) *
                   (1.0 / (dVar21 * dVar22));
            }
            lVar13 = lVar13 + ~(lVar6 + lVar5) * 8;
          }
          lVar15 = lVar15 + 1;
          local_90 = local_90 + -8;
        }
      }
    }
    msgfmt = "The gloc or gcomm routine failed in an unrecoverable manner.";
    iVar7 = 0x1ab;
  }
  else {
    msgfmt = "An error arose from a SUNBandMatrix routine.";
    iVar7 = 0x1a2;
  }
  KINProcessError(kin_mem,-1,iVar7,"KINBBDPrecSetup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_bbdpre.c"
                  ,msgfmt);
  return -1;
}

Assistant:

static int KINBBDPrecSetup(N_Vector uu, N_Vector uscale,
                           SUNDIALS_MAYBE_UNUSED N_Vector fval,
                           SUNDIALS_MAYBE_UNUSED N_Vector fscale, void* bbd_data)
{
  KBBDPrecData pdata;
  KINMem kin_mem;
  int retval;

  pdata = (KBBDPrecData)bbd_data;

  kin_mem = (KINMem)pdata->kin_mem;

  /* Call KBBDDQJac for a new Jacobian calculation and store in PP */
  retval = SUNMatZero(pdata->PP);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_SUNMAT_FAIL);
    return (-1);
  }

  retval = KBBDDQJac(pdata, uu, uscale, pdata->tempv1, pdata->tempv2,
                     pdata->tempv3);
  if (retval != 0)
  {
    KINProcessError(kin_mem, -1, __LINE__, __func__, __FILE__,
                    MSGBBD_FUNC_FAILED);
    return (-1);
  }

  /* Do LU factorization of P and return error flag */
  retval = SUNLinSolSetup_Band(pdata->LS, pdata->PP);
  return (retval);
}